

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O2

StreamSep * __thiscall Hpipe::StreamSep::operator<<(StreamSep *this,char (*val) [37])

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->stream,(string *)&this->sep);
  std::operator<<(poVar1,*val);
  return this;
}

Assistant:

StreamSep &operator<<( const T &val ) {
        *stream << sep << val;
        return *this;
    }